

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O2

Result __thiscall
ruckig::TargetCalculator<0UL,_MinimalDynamicDofsVector>::calculate<false>
          (TargetCalculator<0UL,_MinimalDynamicDofsVector> *this,
          InputParameter<0UL,_MinimalDynamicDofsVector> *inp,
          Trajectory<0UL,_MinimalDynamicDofsVector> *traj,double delta_time,bool *was_interrupted)

{
  Vector<double> *this_00;
  Vector<double> *this_01;
  iterator *this_02;
  Vector<double> *this_03;
  Vector<double> *this_04;
  Vector<bool> *this_05;
  Vector<double> *this_06;
  Vector<double> *this_07;
  byte bVar1;
  DurationDiscretization DVar2;
  ControlSigns CVar3;
  pointer pBVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  ControlInterface CVar8;
  Synchronization SVar9;
  Block *pBVar10;
  MinimalDynamicDofsVector<double,_0UL> *pMVar11;
  MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL> *this_08;
  MinimalDynamicDofsVector<ruckig::Synchronization,_0UL> *this_09;
  long lVar12;
  reference pdVar13;
  reference pPVar14;
  reference this_10;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  pointer __src;
  long lVar19;
  long lVar20;
  size_t dof;
  _Storage<unsigned_long,_true> i;
  ulong __n;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  optional<double> t_min;
  double local_f50;
  double local_f48;
  double local_f40;
  bool found_time_synchronization;
  double local_ee8;
  _Storage<unsigned_long,_true> local_eb8;
  char local_eb0;
  double local_ea8;
  Vector<double> *local_ea0;
  Vector<double> *local_e98;
  optional<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_> *local_e90;
  optional<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_> *local_e88;
  optional<MinimalDynamicDofsVector<double,_0UL>_> *local_e80;
  double local_e78;
  Vector<double> *local_e70;
  double local_e68;
  double local_e60;
  double local_e58;
  _Deque_iterator<double,_double_&,_double_*> *local_e50;
  PositionFirstOrderStep1 step1;
  
  *was_interrupted = false;
  lVar20 = 0;
  local_e78 = delta_time;
  Trajectory<0UL,_MinimalDynamicDofsVector>::resize<0UL,_0>(traj,0);
  this_03 = &inp->max_velocity;
  this_04 = &inp->max_acceleration;
  local_e80 = &inp->min_acceleration;
  local_e88 = &inp->per_dof_control_interface;
  local_e90 = &inp->per_dof_synchronization;
  this_05 = &inp->enabled;
  this_00 = &inp->current_position;
  this_01 = &inp->current_velocity;
  this_06 = &inp->current_acceleration;
  this_07 = &inp->max_jerk;
  local_e98 = &inp->target_velocity;
  local_ea0 = &inp->target_acceleration;
  local_e70 = &inp->target_position;
  local_e50 = &(traj->independent_min_durations).data.
               super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
               _M_start;
  for (uVar17 = 0; uVar17 < this->degrees_of_freedom; uVar17 = uVar17 + 1) {
    pBVar10 = (Block *)std::_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*>::
                       operator[]((_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*>
                                   *)((long)&(((traj->profiles).
                                               super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->data).
                                             super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                                     + 0x10),uVar17);
    if ((inp->min_velocity).
        super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>._M_payload.
        super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>.
        super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>._M_engaged == true) {
      pMVar11 = std::optional<MinimalDynamicDofsVector<double,_0UL>_>::value(&inp->min_velocity);
      dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](pMVar11,uVar17);
    }
    else {
      dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
      dVar21 = (double)((ulong)dVar21 ^ (ulong)DAT_00128080);
    }
    (this->inp_min_velocity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar17] = dVar21;
    if ((inp->min_acceleration).
        super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>._M_payload.
        super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>.
        super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>._M_engaged == true) {
      pMVar11 = std::optional<MinimalDynamicDofsVector<double,_0UL>_>::value(local_e80);
      dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](pMVar11,uVar17);
    }
    else {
      dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
      dVar21 = (double)((ulong)dVar21 ^ (ulong)DAT_00128080);
    }
    (this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar17] = dVar21;
    if ((inp->per_dof_control_interface).
        super__Optional_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_false,_false>.
        _M_payload.
        super__Optional_payload<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_true,_false,_false>
        .super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_>.
        _M_engaged == true) {
      this_08 = std::optional<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_>::value
                          (local_e88);
      CVar8 = MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>::operator[](this_08,uVar17);
    }
    else {
      CVar8 = inp->control_interface;
    }
    (this->inp_per_dof_control_interface).
    super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>._M_impl.
    super__Vector_impl_data._M_start[uVar17] = CVar8;
    if ((inp->per_dof_synchronization).
        super__Optional_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_false,_false>.
        _M_payload.
        super__Optional_payload<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_true,_false,_false>
        .super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_>.
        _M_engaged == true) {
      this_09 = std::optional<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_>::value
                          (local_e90);
      SVar9 = MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>::operator[](this_09,uVar17);
    }
    else {
      SVar9 = inp->synchronization;
    }
    (this->inp_per_dof_synchronization).
    super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>._M_impl.
    super__Vector_impl_data._M_start[uVar17] = SVar9;
    bVar5 = MinimalDynamicDofsVector<bool,_0UL>::operator[](this_05,uVar17);
    if (bVar5) {
      CVar8 = (this->inp_per_dof_control_interface).
              super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar17];
      if (CVar8 == Velocity) {
        dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
        if (ABS(dVar21) == INFINITY) {
          ruckig::BrakeProfile::get_second_order_velocity_brake_trajectory();
        }
        else {
          dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_06,uVar17);
          dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
          dVar21 = (this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar17];
          dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
          ruckig::BrakeProfile::get_velocity_brake_trajectory(dVar22,dVar23,dVar21,dVar24);
        }
        dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_00,uVar17);
        local_f50 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_01,uVar17);
        local_f48 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_06,uVar17);
        local_f40 = MinimalDynamicDofsVector<double,_0UL>::operator[](local_e98,uVar17);
        dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](local_ea0,uVar17);
        lVar12 = 0x220;
        lVar15 = 0x228;
        lVar16 = 0x128;
        lVar18 = 0xe8;
        lVar19 = 0xa8;
LAB_00114ce3:
        *(double *)((long)(pBVar10->p_min).t._M_elems + lVar19) = local_f48;
        *(double *)((long)(pBVar10->p_min).t._M_elems + lVar18) = local_f50;
        *(double *)((long)(pBVar10->p_min).t._M_elems + lVar16) = dVar22;
        *(double *)((long)(pBVar10->p_min).t._M_elems + lVar15) = dVar21;
        *(double *)((long)(pBVar10->p_min).t._M_elems + lVar12) = local_f40;
      }
      else if (CVar8 == Position) {
        dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
        if (ABS(dVar21) == INFINITY) {
          dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
          if (ABS(dVar21) != INFINITY) {
            dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_01,uVar17);
            dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
            dVar21 = (this->inp_min_velocity).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar17];
            dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
            ruckig::BrakeProfile::get_second_order_position_brake_trajectory
                      (dVar22,dVar23,dVar21,dVar24,
                       (this->inp_min_acceleration).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar17]);
          }
        }
        else {
          dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_01,uVar17);
          dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_06,uVar17);
          dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
          dVar21 = (this->inp_min_velocity).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar17];
          dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
          local_ea8 = (this->inp_min_acceleration).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar17];
          dVar26 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
          ruckig::BrakeProfile::get_position_brake_trajectory
                    (dVar22,dVar23,dVar24,dVar21,dVar25,local_ea8,dVar26);
        }
        local_f50 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_00,uVar17);
        local_f48 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_01,uVar17);
        dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_06,uVar17);
        local_f40 = MinimalDynamicDofsVector<double,_0UL>::operator[](local_e70,uVar17);
        dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](local_e98,uVar17);
        dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](local_ea0,uVar17);
        (pBVar10->p_min).a._M_elems[0] = dVar23;
        lVar12 = 0x218;
        lVar15 = 0x220;
        lVar16 = 0x228;
        lVar18 = 0x128;
        lVar19 = 0xe8;
        goto LAB_00114ce3;
      }
      dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
      if (ABS(dVar21) == INFINITY) {
        dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
        if (ABS(dVar21) != INFINITY) {
          BrakeProfile::finalize_second_order
                    (&(pBVar10->p_min).brake,(pBVar10->p_min).p._M_elems,(pBVar10->p_min).v._M_elems
                     ,(pBVar10->p_min).a._M_elems);
        }
      }
      else {
        BrakeProfile::finalize
                  (&(pBVar10->p_min).brake,(pBVar10->p_min).p._M_elems,(pBVar10->p_min).v._M_elems,
                   (pBVar10->p_min).a._M_elems);
      }
      CVar8 = (this->inp_per_dof_control_interface).
              super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar17];
      if (CVar8 == Velocity) {
        dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
        if (ABS(dVar21) == INFINITY) {
          dVar21 = (pBVar10->p_min).v._M_elems[0];
          dVar22 = (pBVar10->p_min).vf;
          dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
          ruckig::VelocitySecondOrderStep1::VelocitySecondOrderStep1
                    ((VelocitySecondOrderStep1 *)&step1,dVar21,dVar22,dVar23,
                     (this->inp_min_acceleration).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar17]);
          cVar6 = ruckig::VelocitySecondOrderStep1::get_profile((Profile *)&step1,pBVar10);
        }
        else {
          dVar21 = (pBVar10->p_min).a._M_elems[0];
          dVar22 = (pBVar10->p_min).v._M_elems[0];
          dVar23 = (pBVar10->p_min).vf;
          dVar24 = (pBVar10->p_min).af;
          dVar26 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
          dVar25 = (this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar17];
          dVar27 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
          ruckig::VelocityThirdOrderStep1::VelocityThirdOrderStep1
                    ((VelocityThirdOrderStep1 *)&step1,dVar22,dVar21,dVar23,dVar24,dVar26,dVar25,
                     dVar27);
          cVar6 = ruckig::VelocityThirdOrderStep1::get_profile((Profile *)&step1,pBVar10);
        }
      }
      else {
        if (CVar8 != Position) goto LAB_001153bd;
        dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
        if (ABS(dVar21) == INFINITY) {
          dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
          if (ABS(dVar21) == INFINITY) {
            dVar21 = (pBVar10->p_min).p._M_elems[0];
            dVar22 = (pBVar10->p_min).pf;
            dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
            ruckig::PositionFirstOrderStep1::PositionFirstOrderStep1
                      (&step1,dVar21,dVar22,dVar23,
                       (this->inp_min_velocity).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar17]);
            cVar6 = ruckig::PositionFirstOrderStep1::get_profile((Profile *)&step1,pBVar10);
          }
          else {
            dVar21 = (pBVar10->p_min).v._M_elems[0];
            dVar22 = (pBVar10->p_min).p._M_elems[0];
            dVar23 = (pBVar10->p_min).pf;
            dVar24 = (pBVar10->p_min).vf;
            dVar26 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
            dVar25 = (this->inp_min_velocity).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar17];
            dVar27 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
            ruckig::PositionSecondOrderStep1::PositionSecondOrderStep1
                      ((PositionSecondOrderStep1 *)&step1,dVar22,dVar21,dVar23,dVar24,dVar26,dVar25,
                       dVar27,(this->inp_min_acceleration).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar17]);
            cVar6 = ruckig::PositionSecondOrderStep1::get_profile((Profile *)&step1,pBVar10);
          }
        }
        else {
          dVar21 = (pBVar10->p_min).p._M_elems[0];
          dVar22 = (pBVar10->p_min).a._M_elems[0];
          dVar23 = (pBVar10->p_min).v._M_elems[0];
          dVar24 = (pBVar10->p_min).pf;
          dVar25 = (pBVar10->p_min).vf;
          dVar26 = (pBVar10->p_min).af;
          local_ea8 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
          local_e58 = (this->inp_min_velocity).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar17];
          local_e60 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
          local_e68 = (this->inp_min_acceleration).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar17];
          dVar27 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
          ruckig::PositionThirdOrderStep1::PositionThirdOrderStep1
                    ((PositionThirdOrderStep1 *)&step1,dVar21,dVar23,dVar22,dVar24,dVar25,dVar26,
                     local_ea8,local_e58,local_e60,local_e68,dVar27);
          cVar6 = ruckig::PositionThirdOrderStep1::get_profile((Profile *)&step1,pBVar10);
        }
      }
      if (cVar6 == '\0') {
LAB_001153bd:
        dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
        if (((dVar21 != 0.0) || (NAN(dVar21))) &&
           ((dVar21 = (this->inp_min_acceleration).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar17], dVar21 != 0.0 || (NAN(dVar21))))) {
          dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
          if ((dVar21 != 0.0) || (NAN(dVar21))) {
            return ErrorExecutionTimeCalculation;
          }
        }
        return ErrorZeroLimits;
      }
      dVar21 = *(double *)
                ((long)&((this->blocks).
                         super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>._M_impl.
                         super__Vector_impl_data._M_start)->t_min + lVar20);
      pdVar13 = std::_Deque_iterator<double,_double_&,_double_*>::operator[](local_e50,uVar17);
      *pdVar13 = dVar21;
    }
    else {
      dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_00,uVar17);
      (pBVar10->p_min).p._M_elems[7] = dVar21;
      dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_01,uVar17);
      (pBVar10->p_min).v._M_elems[7] = dVar21;
      dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_06,uVar17);
      (pBVar10->p_min).a._M_elems[7] = dVar21;
      (pBVar10->p_min).t_sum._M_elems[6] = 0.0;
      pBVar4 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pBVar4->t_min + lVar20) = 0;
      if (*(char *)((long)&(pBVar4->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                           _M_payload + lVar20 + 0x250) == '\x01') {
        *(undefined1 *)
         ((long)&(pBVar4->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload +
         lVar20 + 0x250) = 0;
      }
      if (*(char *)((long)&(pBVar4->b).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                           _M_payload + lVar20 + 0x250) == '\x01') {
        *(undefined1 *)
         ((long)&(pBVar4->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload +
         lVar20 + 0x250) = 0;
      }
    }
    lVar20 = lVar20 + 0x6f8;
  }
  DVar2 = inp->duration_discretization;
  bVar5 = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
          super__Optional_payload_base<double>._M_engaged;
  if ((this->degrees_of_freedom == 1 && (bVar5 & 1U) == 0) && DVar2 != Discrete) {
    pBVar4 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
             _M_impl.super__Vector_impl_data._M_start;
    traj->duration = pBVar4->t_min;
    pPVar14 = std::_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*>::
              operator[]((_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*> *)
                         ((long)&(((traj->profiles).
                                   super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->data).
                                 super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                         + 0x10),0);
    memcpy(pPVar14,pBVar4,0x23c);
    *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start = traj->duration;
    return Working;
  }
  local_eb0 = '\0';
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = bVar5;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_payload;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_7_ = 0;
  bVar5 = synchronize(this,t_min,&traj->duration,(optional<unsigned_long> *)&local_eb8,
                      (traj->profiles).
                      super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,DVar2 == Discrete,local_e78);
  if (!bVar5) {
    uVar17 = 0;
    do {
      if (this->degrees_of_freedom <= uVar17) {
        return ErrorSynchronizationCalculation;
      }
      dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
      if ((dVar21 == 0.0) && (!NAN(dVar21))) {
        return ErrorZeroLimits;
      }
      dVar21 = (this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar17];
      if ((dVar21 == 0.0) && (!NAN(dVar21))) {
        return ErrorZeroLimits;
      }
      dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
      uVar17 = uVar17 + 1;
    } while ((dVar21 != 0.0) || (NAN(dVar21)));
    return ErrorZeroLimits;
  }
  lVar20 = 0;
  for (i._M_value = 0; uVar17 = this->degrees_of_freedom, i._M_value < uVar17;
      i._M_value = i._M_value + 1) {
    bVar5 = MinimalDynamicDofsVector<bool,_0UL>::operator[](this_05,i._M_value);
    if ((bVar5) &&
       ((this->inp_per_dof_synchronization).
        super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>.
        _M_impl.super__Vector_impl_data._M_start[i._M_value] == None)) {
      pBVar4 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pPVar14 = std::_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*>::
                operator[]((_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*> *
                           )((long)&(((traj->profiles).
                                      super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->data).
                                    super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                            + 0x10),i._M_value);
      memcpy(pPVar14,(void *)((long)(pBVar4->p_min).t._M_elems + lVar20),0x23c);
      dVar21 = *(double *)
                ((long)&((this->blocks).
                         super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>._M_impl.
                         super__Vector_impl_data._M_start)->t_min + lVar20);
      if (traj->duration <= dVar21 && dVar21 != traj->duration) {
        traj->duration = dVar21;
        local_eb0 = '\x01';
        local_eb8 = i;
      }
    }
    lVar20 = lVar20 + 0x6f8;
  }
  dVar21 = traj->duration;
  *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = dVar21;
  if (7600.0 < dVar21) {
    return ErrorTrajectoryDuration;
  }
  if ((dVar21 == 0.0) && (!NAN(dVar21))) {
    lVar20 = 0;
    for (__n = 0; __n < uVar17; __n = __n + 1) {
      pBVar4 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pPVar14 = std::_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*>::
                operator[]((_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*> *
                           )((long)&(((traj->profiles).
                                      super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->data).
                                    super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                            + 0x10),__n);
      memcpy(pPVar14,(void *)((long)(pBVar4->p_min).t._M_elems + lVar20),0x23c);
      uVar17 = this->degrees_of_freedom;
      lVar20 = lVar20 + 0x6f8;
    }
    return Working;
  }
  if ((DVar2 == Discrete) ||
     (bVar5 = std::
              all_of<__gnu_cxx::__normal_iterator<ruckig::Synchronization*,std::vector<ruckig::Synchronization,std::allocator<ruckig::Synchronization>>>,ruckig::TargetCalculator<0ul,MinimalDynamicDofsVector>::calculate<false>(ruckig::InputParameter<0ul,MinimalDynamicDofsVector>const&,ruckig::Trajectory<0ul,MinimalDynamicDofsVector>&,double,bool&)::_lambda(ruckig::Synchronization)_1_>
                        ((this->inp_per_dof_synchronization).
                         super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->inp_per_dof_synchronization).
                         super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                         ._M_impl.super__Vector_impl_data._M_finish), !bVar5)) {
    if ((local_eb0 == '\x01') &&
       (bVar5 = std::
                any_of<__gnu_cxx::__normal_iterator<ruckig::Synchronization*,std::vector<ruckig::Synchronization,std::allocator<ruckig::Synchronization>>>,ruckig::TargetCalculator<0ul,MinimalDynamicDofsVector>::calculate<false>(ruckig::InputParameter<0ul,MinimalDynamicDofsVector>const&,ruckig::Trajectory<0ul,MinimalDynamicDofsVector>&,double,bool&)::_lambda(ruckig::Synchronization)_2_>
                          ((this->inp_per_dof_synchronization).
                           super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->inp_per_dof_synchronization).
                           super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                           ._M_impl.super__Vector_impl_data._M_finish), bVar5)) {
      if ((local_eb0 == '\0') ||
         (pPVar14 = std::_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*>::
                    operator[]((_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*>
                                *)((long)&(((traj->profiles).
                                            super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->data).
                                          super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                                  + 0x10),local_eb8._M_value), local_eb0 == '\0')) {
        std::__throw_bad_optional_access();
      }
      bVar5 = is_input_collinear(this,inp,pPVar14->direction,local_eb8._M_value);
      if (bVar5) {
        this_02 = &(this->new_phase_control).data.super__Deque_base<double,_std::allocator<double>_>
                   ._M_impl.super__Deque_impl_data._M_start;
        bVar1 = 1;
        for (uVar17 = 0; uVar17 < this->degrees_of_freedom; uVar17 = uVar17 + 1) {
          bVar5 = MinimalDynamicDofsVector<bool,_0UL>::operator[](this_05,uVar17);
          if ((bVar5) &&
             (((local_eb0 != '\x01' || (uVar17 != local_eb8._M_value)) &&
              ((this->inp_per_dof_synchronization).
               super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar17] == Phase)))) {
            this_10 = std::_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*>::
                      operator[]((_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*>
                                  *)((long)&(((traj->profiles).
                                              super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->data).
                                            super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                                    + 0x10),uVar17);
            dVar26 = (traj->duration - (this_10->brake).duration) - (this_10->accel).duration;
            (this_10->t)._M_elems[6] = (pPVar14->t)._M_elems[6];
            dVar24 = (pPVar14->t)._M_elems[0];
            dVar25 = (pPVar14->t)._M_elems[1];
            dVar21 = (pPVar14->t)._M_elems[2];
            dVar22 = (pPVar14->t)._M_elems[3];
            dVar23 = (pPVar14->t)._M_elems[5];
            (this_10->t)._M_elems[4] = (pPVar14->t)._M_elems[4];
            (this_10->t)._M_elems[5] = dVar23;
            (this_10->t)._M_elems[2] = dVar21;
            (this_10->t)._M_elems[3] = dVar22;
            (this_10->t)._M_elems[0] = dVar24;
            (this_10->t)._M_elems[1] = dVar25;
            CVar3 = pPVar14->control_signs;
            this_10->control_signs = CVar3;
            CVar8 = (this->inp_per_dof_control_interface).
                    super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar17];
            if (CVar8 == Velocity) {
              if (CVar3 == UDUD) {
                dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
                pdVar13 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                                    (this_02,uVar17);
                dVar21 = *pdVar13;
                dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
                dVar22 = (this->inp_min_acceleration).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar17];
                if (ABS(dVar23) == INFINITY) {
                  bVar5 = Profile::
                          check_for_second_order_velocity_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                    (this_10,dVar26,dVar21,dVar24,dVar22);
                }
                else {
                  dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
                  bVar5 = Profile::
                          check_for_velocity_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                    (this_10,dVar26,dVar21,dVar24,dVar22,dVar23);
                }
              }
              else {
                if (CVar3 != UDDU) goto LAB_00115c55;
                dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
                pdVar13 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                                    (this_02,uVar17);
                dVar21 = *pdVar13;
                dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
                dVar22 = (this->inp_min_acceleration).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar17];
                if (ABS(dVar23) == INFINITY) {
                  bVar5 = Profile::
                          check_for_second_order_velocity_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                    (this_10,dVar26,dVar21,dVar24,dVar22);
                }
                else {
                  dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
                  bVar5 = Profile::
                          check_for_velocity_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                    (this_10,dVar26,dVar21,dVar24,dVar22,dVar23);
                }
              }
LAB_00115c4c:
              bVar1 = bVar1 & bVar5;
            }
            else if (CVar8 == Position) {
              if (CVar3 == UDUD) {
                dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
                pdVar13 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                                    (this_02,uVar17);
                dVar21 = *pdVar13;
                if (ABS(dVar22) == INFINITY) {
                  pdVar13 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                                      (this_02,uVar17);
                  local_ee8 = -*pdVar13;
                  dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
                  dVar22 = (this->inp_min_velocity).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17];
                  dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
                  bVar5 = Profile::
                          check_for_second_order_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                    (this_10,dVar26,dVar21,local_ee8,dVar23,dVar22,dVar24,
                                     (this->inp_min_acceleration).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar17]);
                }
                else {
                  dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
                  dVar22 = (this->inp_min_velocity).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17];
                  dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
                  dVar23 = (this->inp_min_acceleration).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17];
                  dVar27 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
                  bVar5 = Profile::
                          check_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                    (this_10,dVar26,dVar21,dVar24,dVar22,dVar25,dVar23,dVar27);
                }
              }
              else {
                if (CVar3 != UDDU) goto LAB_00115c55;
                dVar21 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
                if (ABS(dVar21) == INFINITY) {
                  dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
                  pdVar13 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                                      (this_02,uVar17);
                  dVar21 = *pdVar13;
                  if (ABS(dVar22) == INFINITY) {
                    dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
                    bVar5 = Profile::
                            check_for_first_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                      (this_10,dVar26,dVar21,dVar22,
                                       (this->inp_min_velocity).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar17]);
                  }
                  else {
                    pdVar13 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                                        (this_02,uVar17);
                    local_ee8 = -*pdVar13;
                    dVar23 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
                    dVar22 = (this->inp_min_velocity).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar17];
                    dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
                    bVar5 = Profile::
                            check_for_second_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                      (this_10,dVar26,dVar21,local_ee8,dVar23,dVar22,dVar24,
                                       (this->inp_min_acceleration).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar17]);
                  }
                }
                else {
                  pdVar13 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                                      (this_02,uVar17);
                  dVar21 = *pdVar13;
                  dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
                  dVar22 = (this->inp_min_velocity).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17];
                  dVar25 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
                  dVar23 = (this->inp_min_acceleration).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17];
                  dVar27 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
                  bVar5 = Profile::
                          check_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                    (this_10,dVar26,dVar21,dVar24,dVar22,dVar25,dVar23,dVar27);
                }
              }
              goto LAB_00115c4c;
            }
LAB_00115c55:
            this_10->limits = pPVar14->limits;
          }
        }
        if ((bVar1 != 0) &&
           (bVar5 = std::
                    all_of<__gnu_cxx::__normal_iterator<ruckig::Synchronization*,std::vector<ruckig::Synchronization,std::allocator<ruckig::Synchronization>>>,ruckig::TargetCalculator<0ul,MinimalDynamicDofsVector>::calculate<false>(ruckig::InputParameter<0ul,MinimalDynamicDofsVector>const&,ruckig::Trajectory<0ul,MinimalDynamicDofsVector>&,double,bool&)::_lambda(ruckig::Synchronization)_3_>
                              ((this->inp_per_dof_synchronization).
                               super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (this->inp_per_dof_synchronization).
                               super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                               ._M_impl.super__Vector_impl_data._M_finish), bVar5)) {
          return Working;
        }
      }
    }
    lVar20 = 0;
    for (uVar17 = 0; uVar17 < this->degrees_of_freedom; uVar17 = uVar17 + 1) {
      if (((local_eb0 == '\x01') && (uVar17 == local_eb8._M_value)) ||
         (bVar5 = true,
         (this->inp_per_dof_synchronization).
         super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar17] == None)) {
        bVar5 = DVar2 == Discrete;
      }
      bVar7 = MinimalDynamicDofsVector<bool,_0UL>::operator[](this_05,uVar17);
      if ((bVar7 & bVar5) == 1) {
        pPVar14 = std::_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*>::
                  operator[]((_Deque_iterator<ruckig::Profile,_ruckig::Profile_&,_ruckig::Profile_*>
                              *)((long)&(((traj->profiles).
                                          super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->data).
                                        super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                                + 0x10),uVar17);
        dVar21 = (traj->duration - (pPVar14->brake).duration) - (pPVar14->accel).duration;
        if ((((this->inp_per_dof_synchronization).
              super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar17] != TimeIfNecessary) ||
            (dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](local_e98,uVar17),
            2.220446049250313e-16 <= ABS(dVar22))) ||
           (dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](local_ea0,uVar17),
           2.220446049250313e-16 <= ABS(dVar22))) {
          pBVar4 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          __src = pBVar4 + uVar17;
          if (4.440892098500626e-16 <= ABS(dVar21 - *(double *)((long)&pBVar4->t_min + lVar20))) {
            if ((*(char *)((long)&(pBVar4->a).
                                  super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                  _M_payload + lVar20 + 0x250) != '\x01') ||
               (4.440892098500626e-16 <=
                ABS(dVar21 - *(double *)
                              ((long)&(pBVar4->a).
                                      super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                      _M_payload + lVar20 + 8)))) {
              if ((*(char *)((long)&(pBVar4->b).
                                    super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                    _M_payload + lVar20 + 0x250) != '\x01') ||
                 (4.440892098500626e-16 <=
                  ABS(dVar21 - *(double *)
                                ((long)&(pBVar4->b).
                                        super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                        _M_payload + lVar20 + 8)))) {
                CVar8 = (this->inp_per_dof_control_interface).
                        super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar17];
                if (CVar8 == Velocity) {
                  dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
                  if (ABS(dVar22) == INFINITY) {
                    dVar22 = (pPVar14->v)._M_elems[0];
                    dVar23 = pPVar14->vf;
                    dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
                    ruckig::VelocitySecondOrderStep2::VelocitySecondOrderStep2
                              ((VelocitySecondOrderStep2 *)&step1,dVar21,dVar22,dVar23,dVar24,
                               (this->inp_min_acceleration).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar17]);
                    cVar6 = ruckig::VelocitySecondOrderStep2::get_profile((Profile *)&step1);
                  }
                  else {
                    dVar22 = (pPVar14->a)._M_elems[0];
                    dVar23 = (pPVar14->v)._M_elems[0];
                    dVar24 = pPVar14->vf;
                    dVar25 = pPVar14->af;
                    dVar27 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
                    dVar26 = (this->inp_min_acceleration).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar17];
                    dVar29 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
                    ruckig::VelocityThirdOrderStep2::VelocityThirdOrderStep2
                              ((VelocityThirdOrderStep2 *)&step1,dVar21,dVar23,dVar22,dVar24,dVar25,
                               dVar27,dVar26,dVar29);
                    cVar6 = ruckig::VelocityThirdOrderStep2::get_profile((Profile *)&step1);
                  }
                }
                else {
                  if (CVar8 != Position) {
                    return ErrorSynchronizationCalculation;
                  }
                  dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
                  if (ABS(dVar22) == INFINITY) {
                    dVar22 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
                    if (ABS(dVar22) == INFINITY) {
                      dVar22 = (pPVar14->p)._M_elems[0];
                      dVar23 = pPVar14->pf;
                      dVar24 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
                      ruckig::PositionFirstOrderStep2::PositionFirstOrderStep2
                                ((PositionFirstOrderStep2 *)&step1,dVar21,dVar22,dVar23,dVar24,
                                 (this->inp_min_velocity).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar17]);
                      cVar6 = ruckig::PositionFirstOrderStep2::get_profile((Profile *)&step1);
                    }
                    else {
                      dVar22 = (pPVar14->v)._M_elems[0];
                      dVar23 = (pPVar14->p)._M_elems[0];
                      dVar24 = pPVar14->pf;
                      dVar25 = pPVar14->vf;
                      dVar27 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
                      dVar26 = (this->inp_min_velocity).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar17];
                      dVar29 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17);
                      ruckig::PositionSecondOrderStep2::PositionSecondOrderStep2
                                ((PositionSecondOrderStep2 *)&step1,dVar21,dVar23,dVar22,dVar24,
                                 dVar25,dVar27,dVar26,dVar29,
                                 (this->inp_min_acceleration).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar17]);
                      cVar6 = ruckig::PositionSecondOrderStep2::get_profile((Profile *)&step1);
                    }
                  }
                  else {
                    dVar22 = (pPVar14->p)._M_elems[0];
                    dVar23 = (pPVar14->a)._M_elems[0];
                    dVar24 = (pPVar14->v)._M_elems[0];
                    dVar25 = pPVar14->pf;
                    dVar26 = pPVar14->vf;
                    dVar27 = pPVar14->af;
                    dVar29 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_03,uVar17);
                    local_e80 = (optional<MinimalDynamicDofsVector<double,_0UL>_> *)
                                (this->inp_min_velocity).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar17];
                    local_e88 = (optional<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_>
                                 *)MinimalDynamicDofsVector<double,_0UL>::operator[](this_04,uVar17)
                    ;
                    local_e90 = (optional<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_> *
                                )(this->inp_min_acceleration).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar17];
                    dVar28 = MinimalDynamicDofsVector<double,_0UL>::operator[](this_07,uVar17);
                    ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
                              ((PositionThirdOrderStep2 *)&step1,dVar21,dVar22,dVar24,dVar23,dVar25,
                               dVar26,dVar27,dVar29,(double)local_e80,(double)local_e88,
                               (double)local_e90,dVar28);
                    cVar6 = ruckig::PositionThirdOrderStep2::get_profile((Profile *)&step1);
                  }
                }
                if (cVar6 == '\0') {
                  return ErrorSynchronizationCalculation;
                }
                goto LAB_001162c6;
              }
              __src = (pointer)((long)&(__src->b).
                                       super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                       _M_payload + 0x10);
            }
            else {
              __src = (pointer)((long)&(__src->a).
                                       super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                       _M_payload + 0x10);
            }
          }
        }
        else {
          __src = (pointer)((long)(((this->blocks).
                                    super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->p_min).t._M_elems +
                           lVar20);
        }
        memcpy(pPVar14,__src,0x23c);
      }
LAB_001162c6:
      lVar20 = lVar20 + 0x6f8;
    }
  }
  return Working;
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& inp, Trajectory<DOFs, CustomVector>& traj, double delta_time, bool& was_interrupted) {
        was_interrupted = false;
#if defined WITH_CLOUD_CLIENT
        traj.resize(0);
#endif

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            auto& p = traj.profiles[0][dof];

            inp_min_velocity[dof] = inp.min_velocity ? inp.min_velocity.value()[dof] : -inp.max_velocity[dof];
            inp_min_acceleration[dof] = inp.min_acceleration ? inp.min_acceleration.value()[dof] : -inp.max_acceleration[dof];
            inp_per_dof_control_interface[dof] = inp.per_dof_control_interface ? inp.per_dof_control_interface.value()[dof] : inp.control_interface;
            inp_per_dof_synchronization[dof] = inp.per_dof_synchronization ? inp.per_dof_synchronization.value()[dof] : inp.synchronization;

            if (!inp.enabled[dof]) {
                p.p.back() = inp.current_position[dof];
                p.v.back() = inp.current_velocity[dof];
                p.a.back() = inp.current_acceleration[dof];
                p.t_sum.back() = 0.0;
                blocks[dof].t_min = 0.0;
                blocks[dof].a = std::nullopt;
                blocks[dof].b = std::nullopt;
                continue;
            }

            // Calculate brake (if input exceeds or will exceed limits)
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_position_brake_trajectory(inp.current_velocity[dof], inp.current_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        p.brake.get_second_order_position_brake_trajectory(inp.current_velocity[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                        // p.accel.get_second_order_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                    }
                    p.set_boundary(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_position[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_velocity_brake_trajectory(inp.current_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_velocity_brake_trajectory(inp.target_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else {
                        p.brake.get_second_order_velocity_brake_trajectory();
                        // p.accel.get_second_order_velocity_brake_trajectory();
                    }
                    p.set_boundary_for_velocity(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
            }

            // Finalize pre & post-trajectories
            if (!std::isinf(inp.max_jerk[dof])) {
                p.brake.finalize(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize(p.pf, p.vf, p.af);
            } else if (!std::isinf(inp.max_acceleration[dof])) {
                p.brake.finalize_second_order(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize_second_order(p.pf, p.vf, p.af);
            }

            bool found_profile {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep1 step1 {p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep1 step1 {p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        PositionFirstOrderStep1 step1 {p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep1 step1 {p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        VelocitySecondOrderStep1 step1 {p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
            }

            if (!found_profile) {
                const bool has_zero_limits = (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0);
                if (has_zero_limits) {
                    if constexpr (throw_error) {
                        throw RuckigError("zero limits conflict in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorZeroLimits;
                    }

                } else {
                    if constexpr (throw_error) {
                        throw RuckigError("error in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorExecutionTimeCalculation;
                    }
                }
            }

            traj.independent_min_durations[dof] = blocks[dof].t_min;
            // std::cout << dof << " profile step1: " << blocks[dof].to_string() << std::endl;
        }

        const bool discrete_duration = (inp.duration_discretization == DurationDiscretization::Discrete);
        if (degrees_of_freedom == 1 && !inp.minimum_duration && !discrete_duration) {
            traj.duration = blocks[0].t_min;
            traj.profiles[0][0] = blocks[0].p_min;
            traj.cumulative_times[0] = traj.duration;
            return Result::Working;
        }

        std::optional<size_t> limiting_dof; // The DoF that doesn't need step 2
        const bool found_synchronization = synchronize(inp.minimum_duration, traj.duration, limiting_dof, traj.profiles[0], discrete_duration, delta_time);
        if (!found_synchronization) {
            bool has_zero_limits = false;
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0) {
                    has_zero_limits = true;
                    break;
                }
            }

            if (has_zero_limits) {
                if constexpr (throw_error) {
                    throw RuckigError("zero limits conflict with other degrees of freedom in time synchronization " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorZeroLimits;
                }

            } else {
                if constexpr (throw_error) {
                    throw RuckigError("error in time synchronization: " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
        }

        // None Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp.enabled[dof] && inp_per_dof_synchronization[dof] == Synchronization::None) {
                traj.profiles[0][dof] = blocks[dof].p_min;
                if (blocks[dof].t_min > traj.duration) {
                    traj.duration = blocks[dof].t_min;
                    limiting_dof = dof;
                }
            }
        }
        traj.cumulative_times[0] = traj.duration;

        if constexpr (return_error_at_maximal_duration) {
            if (traj.duration > 7.6e3) {
                return Result::ErrorTrajectoryDuration;
            }
        }

        if (traj.duration == 0.0) {
            // Copy all profiles for end state
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                traj.profiles[0][dof] = blocks[dof].p_min;
            }
            return Result::Working;
        }

        if (!discrete_duration && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::None; })) {
            return Result::Working;
        }

        // Phase Synchronization
        if (limiting_dof && std::any_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase; })) {
            const Profile& p_limiting = traj.profiles[0][limiting_dof.value()];
            if (is_input_collinear(inp, p_limiting.direction, limiting_dof.value())) {
                bool found_time_synchronization {true};
                for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                    if (!inp.enabled[dof] || dof == limiting_dof || inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                        continue;
                    }

                    Profile& p = traj.profiles[0][dof];
                    const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

                    p.t = p_limiting.t; // Copy timing information from limiting DoF
                    p.control_signs = p_limiting.control_signs;

                    // Profile::ReachedLimits::NONE is a small hack, as there is no specialization for that in the check function
                    switch (inp_per_dof_control_interface[dof]) {
                        case ControlInterface::Position: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                        case ControlInterface::Velocity: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                    }

                    p.limits = p_limiting.limits; // After check method call to set correct limits
                }

                if (found_time_synchronization && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase || s == Synchronization::None; })) {
                    return Result::Working;
                }
            }
        }

        // Time Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const bool skip_synchronization = (dof == limiting_dof || inp_per_dof_synchronization[dof] == Synchronization::None) && !discrete_duration;
            if (!inp.enabled[dof] || skip_synchronization) {
                continue;
            }

            Profile& p = traj.profiles[0][dof];
            const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

            if (inp_per_dof_synchronization[dof] == Synchronization::TimeIfNecessary && std::abs(inp.target_velocity[dof]) < eps && std::abs(inp.target_acceleration[dof]) < eps) {
                p = blocks[dof].p_min;
                continue;
            }

            // Check if the final time corresponds to an extremal profile calculated in step 1
            // Use 2*eps because of numerical robustness in duration discretization
            if (std::abs(t_profile - blocks[dof].t_min) < 2*eps) {
                p = blocks[dof].p_min;
                continue;
            } else if (blocks[dof].a && std::abs(t_profile - blocks[dof].a->right) < 2*eps) {
                p = blocks[dof].a->profile;
                continue;
            } else if (blocks[dof].b && std::abs(t_profile - blocks[dof].b->right) < 2*eps) {
                p = blocks[dof].b->profile;
                continue;
            }

            bool found_time_synchronization {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        PositionFirstOrderStep2 step2 {t_profile, p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep2 step2 {t_profile, p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        VelocitySecondOrderStep2 step2 {t_profile, p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
            }
            if (!found_time_synchronization) {
                if constexpr (throw_error) {
                    throw RuckigError("error in step 2 in dof: " + std::to_string(dof) + " for t sync: " + std::to_string(traj.duration) + " input: " + inp.to_string());
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
            // std::cout << dof << " profile step2: " << p.to_string() << std::endl;
        }

        return Result::Working;
    }